

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O1

void osgen_auto_vscroll(osgen_txtwin_t *win)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  if (((win->base).flags & 1) != 0) {
    iVar1 = (win->base).y;
    iVar2 = (win->base).scrolly;
    sVar3 = (win->base).ht;
    if ((int)sVar3 + iVar2 <= iVar1) {
      osgen_scroll_win_fwd(win,((long)iVar1 - (sVar3 + (long)iVar2)) + 1);
      return;
    }
  }
  return;
}

Assistant:

static void osgen_auto_vscroll(osgen_txtwin_t *win)
{
    /* if the window isn't in auto-vscroll mode, ignore this */
    if (!(win->base.flags & OSGEN_AUTO_VSCROLL))
        return;
    
    /* 
     *   scroll the window forward if the cursor is outside the visible area
     *   of the window 
     */
    if (win->base.y >= win->base.scrolly + (int)win->base.ht)
        osgen_scroll_win_fwd(win, win->base.y
                             - (win->base.scrolly + win->base.ht) + 1);
}